

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cc
# Opt level: O2

int __thiscall cnn::LSTMBuilder::copy(LSTMBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  pointer pvVar2;
  ulong uVar3;
  pointer pvVar4;
  EVP_PKEY_CTX *src_00;
  size_t j;
  EVP_PKEY_CTX *pEVar5;
  size_t i;
  ulong uVar6;
  
  pvVar4 = (this->params).
           super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->params).
           super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pvVar2 - (long)pvVar4 == *(long *)(dst + 0x30) - *(long *)(dst + 0x28)) {
    for (uVar6 = 0; uVar3 = ((long)pvVar2 - (long)pvVar4) / 0x18, uVar6 < uVar3; uVar6 = uVar6 + 1)
    {
      pEVar5 = (EVP_PKEY_CTX *)0x0;
      while( true ) {
        lVar1 = *(long *)&pvVar4[uVar6].
                          super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                          _M_impl.super__Vector_impl_data;
        src_00 = (EVP_PKEY_CTX *)
                 ((long)*(pointer *)
                         ((long)&pvVar4[uVar6].
                                 super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                 ._M_impl.super__Vector_impl_data + 8) - lVar1 >> 3);
        if (src_00 <= pEVar5) break;
        Parameters::copy(*(Parameters **)(lVar1 + (long)pEVar5 * 8),
                         *(EVP_PKEY_CTX **)
                          (*(long *)(*(long *)(dst + 0x28) + uVar6 * 0x18) + (long)pEVar5 * 8),
                         src_00);
        pEVar5 = pEVar5 + 1;
        pvVar4 = (this->params).
                 super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      pvVar2 = (this->params).
               super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    return (int)uVar3;
  }
  __assert_fail("params.size() == rnn_lstm.params.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/lstm.cc"
                ,0x9b,"virtual void cnn::LSTMBuilder::copy(const RNNBuilder &)");
}

Assistant:

void LSTMBuilder::copy(const RNNBuilder & rnn) {
  const LSTMBuilder & rnn_lstm = (const LSTMBuilder&)rnn;
  assert(params.size() == rnn_lstm.params.size());
  for(size_t i = 0; i < params.size(); ++i)
      for(size_t j = 0; j < params[i].size(); ++j)
        params[i][j]->copy(*rnn_lstm.params[i][j]);
}